

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimePolymorphicInlineCacheInfo.cpp
# Opt level: O1

void JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
               (Recycler *recycler,EntryPointPolymorphicInlineCacheInfo *runtimeInfo,
               CodeGenWorkItemIDL *jitInfo)

{
  undefined8 *puVar1;
  uint uVar2;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *pSVar3;
  code *pcVar4;
  undefined1 auVar5 [8];
  DWORD DVar6;
  undefined8 uVar7;
  bool bVar8;
  BOOL BVar9;
  Recycler *pRVar10;
  PolymorphicInlineCacheInfoIDL *jitInfo_00;
  undefined4 *puVar11;
  PolymorphicInlineCacheInfoIDL *pPVar12;
  size_t sVar13;
  Type *pTVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 local_68 [8];
  TrackAllocData data;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *local_38;
  
  if (runtimeInfo != (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    data._32_8_ = &runtimeInfo->inlineeInfo;
    local_68 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
    pPVar12 = (PolymorphicInlineCacheInfoIDL *)0x0;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_181ebb7;
    data.filename._0_4_ = 0x1a;
    pRVar10 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    jitInfo_00 = (PolymorphicInlineCacheInfoIDL *)new<Memory::Recycler>(0x20,pRVar10,0x572640);
    (jitInfo_00->polymorphicCacheUtilizationArray).ptr = (uchar *)0x0;
    (jitInfo_00->polymorphicInlineCaches).ptr = (PolymorphicInlineCacheIDL *)0x0;
    (jitInfo_00->functionBodyAddr).ptr = (void *)0x0;
    InitializePolymorphicInlineCacheInfo(recycler,&runtimeInfo->selfInfo,jitInfo_00);
    pSVar3 = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
             (runtimeInfo->inlineeInfo).
             super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
             super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
             super_SListNodeBase<Memory::Recycler>.next.ptr;
    Memory::Recycler::WBSetBit(local_68);
    local_68 = (undefined1  [8])pSVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
    if (local_68 != (undefined1  [8])data._32_8_) {
      uVar2 = (runtimeInfo->inlineeInfo).
              super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_RealCount.count;
      uVar16 = (ulong)uVar2;
      local_68 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_181ebb7;
      data.filename._0_4_ = 0x22;
      data.plusSize = uVar16;
      pRVar10 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
      if (uVar16 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar10,(TrackAllocData *)0x0);
        pPVar12 = (PolymorphicInlineCacheInfoIDL *)&DAT_00000008;
      }
      else {
        BVar9 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar9 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_005722da;
          *puVar11 = 0;
        }
        pPVar12 = (PolymorphicInlineCacheInfoIDL *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                            (pRVar10,uVar16 << 5);
        if (pPVar12 == (PolymorphicInlineCacheInfoIDL *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) goto LAB_005722da;
          *puVar11 = 0;
        }
        sVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pPVar12->polymorphicCacheUtilizationArray).ptr + sVar13);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)&(pPVar12->functionBodyAddr).ptr + sVar13) = 0;
          sVar13 = sVar13 + 0x20;
        } while (uVar16 << 5 != sVar13);
      }
      local_68 = (undefined1  [8])data._32_8_;
      data.typeinfo = (type_info *)data._32_8_;
      uVar15 = 0;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (data.typeinfo == (type_info *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_005722da;
          *puVar11 = 0;
        }
        auVar5 = local_68;
        pSVar3 = *(SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> **)
                  data.typeinfo;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38 = pSVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        if ((undefined1  [8])local_38 == auVar5) break;
        data.line = uVar15;
        pSVar3 = *(SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> **)
                  data.typeinfo;
        Memory::Recycler::WBSetBit((char *)&local_38);
        uVar7 = data._32_8_;
        DVar6 = data.line;
        local_38 = pSVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        data.typeinfo = (type_info *)local_38;
        pTVar14 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator
                  ::Data((Iterator *)local_68);
        InitializePolymorphicInlineCacheInfo(recycler,pTVar14->ptr,pPVar12 + (uVar7 & 0xffffffff));
        uVar15 = DVar6 + 1;
      }
      data.typeinfo = (type_info *)0x0;
      if (uVar2 != uVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
                           ,0x2c,"(i == inlineeCount)","i == inlineeCount");
        if (!bVar8) {
LAB_005722da:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
    }
    jitInfo->inlineeInfoCount =
         (runtimeInfo->inlineeInfo).
         super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_RealCount.count;
    jitInfo->selfInfo = jitInfo_00;
    jitInfo->inlineeInfo = pPVar12;
  }
  return;
}

Assistant:

void
JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
    __in Recycler * recycler,
    __in Js::EntryPointPolymorphicInlineCacheInfo * runtimeInfo,
    __out CodeGenWorkItemIDL * jitInfo)
{
    if (runtimeInfo == nullptr)
    {
        return;
    }
    Js::PolymorphicInlineCacheInfo * selfInfo = runtimeInfo->GetSelfInfo();
    SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler> * inlineeList = runtimeInfo->GetInlineeInfo();
    PolymorphicInlineCacheInfoIDL* selfInfoIDL = RecyclerNewStructZ(recycler, PolymorphicInlineCacheInfoIDL);
    PolymorphicInlineCacheInfoIDL* inlineeInfoIDL = nullptr;

    JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, selfInfo, selfInfoIDL);
    
    if (!inlineeList->Empty())
    {
        const uint inlineeCount = inlineeList->Count();
        inlineeInfoIDL = RecyclerNewArray(recycler, PolymorphicInlineCacheInfoIDL, inlineeCount);
        SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(inlineeList);
        uint i = 0;
        while (iter.Next())
        {
            Js::PolymorphicInlineCacheInfo * inlineeInfo = iter.Data();
            __analysis_assume(i < inlineeCount);
            JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, inlineeInfo, &inlineeInfoIDL[i]);
            ++i;
        }
        Assert(i == inlineeCount);
    }
    jitInfo->inlineeInfoCount = inlineeList->Count();
    jitInfo->selfInfo = selfInfoIDL;
    jitInfo->inlineeInfo = inlineeInfoIDL;
}